

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

StateVar * __thiscall
despot::Parser::CreateStateVar
          (StateVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_StateVar)

{
  int iVar1;
  char *pcVar2;
  TiXmlNode *pTVar3;
  string *this_00;
  string value_enum_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string curr_name;
  string prev_name;
  allocator<char> local_119;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  allocator<char> local_e0 [32];
  string local_c0;
  string local_a0;
  string local_80 [32];
  string local_60;
  string local_40 [32];
  
  StateVar::StateVar(__return_storage_ptr__);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnamePrev");
  std::__cxx11::string::string<std::allocator<char>>(local_40,pcVar2,local_e0);
  std::__cxx11::string::string((string *)&local_60,local_40);
  StateVar::prev_name(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnameCurr");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,pcVar2,(allocator<char> *)&local_118);
  std::__cxx11::string::string(local_80,(string *)local_e0);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->curr_name_);
  std::__cxx11::string::~string(local_80);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "false";
  }
  else {
    pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  }
  iVar1 = strcmp(pcVar2,"true");
  __return_storage_ptr__->observed_ = iVar1 == 0;
  pTVar3 = util::tinyxml::TiXmlNode::FirstChild(&e_StateVar->super_TiXmlNode,"ValueEnum");
  if (pTVar3 == (TiXmlNode *)0x0) {
    GetFirstChildText_abi_cxx11_(&local_118,this,e_StateVar,"NumValues");
    iVar1 = atoi(local_118._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"s",(allocator<char> *)&local_118);
    Variable::values((Variable *)__return_storage_ptr__,&local_c0,iVar1);
    this_00 = &local_c0;
  }
  else {
    GetFirstChildText_abi_cxx11_(&local_118,this,e_StateVar,"ValueEnum");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0," ",&local_119);
    Tokenize(&local_f8,&local_118,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    Variable::values((Variable *)__return_storage_ptr__,&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    this_00 = &local_118;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

StateVar Parser::CreateStateVar(TiXmlElement* e_StateVar) {
	StateVar state;

	// vnamePrev
	string prev_name = e_StateVar->Attribute("vnamePrev");
	state.prev_name(prev_name);

	// vnameCurr
	string curr_name = e_StateVar->Attribute("vnameCurr");
	state.curr_name(curr_name);

	// fullyObs
	const char* fully_observed;
	if (e_StateVar->Attribute("fullyObs"))
		fully_observed = e_StateVar->Attribute("fullyObs");
	else
		fully_observed = "false"; //default is false
	state.observed(strcmp(fully_observed, "true") == 0);

	// ValueEnum or NumValues
	if (e_StateVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_StateVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		state.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_StateVar, "NumValues").c_str());
		state.values("s", num);
	}

	return state;
}